

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O3

bool __thiscall
Am_Image_Array_Data::Get_RGB_Image(Am_Image_Array_Data *this,uchar *storage,bool top_first)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Am_RGB_Value *pAVar4;
  uchar uVar5;
  bool bVar6;
  uint uVar7;
  Am_Generic_Image *pAVar8;
  byte *pbVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  uchar *puVar20;
  uint uVar21;
  byte *pbVar22;
  
  pAVar8 = this->image_;
  if (pAVar8 == (Am_Generic_Image *)0x0) {
    bVar6 = make_generic_image_from_name(this);
    if (!bVar6) {
      return false;
    }
    pAVar8 = this->image_;
  }
  pbVar9 = pAVar8->imdata;
  if (pbVar9 == (byte *)0x0) {
    return false;
  }
  uVar2 = (pAVar8->iminfo).width;
  uVar10 = (ulong)uVar2;
  uVar3 = (pAVar8->iminfo).height;
  uVar13 = (ulong)uVar3;
  if (this->name == (char *)0x0) {
    uVar7 = uVar2 + 7 & 0xfffffff8;
    if (top_first) {
      if (uVar3 != 0) {
        iVar15 = 0;
        iVar16 = 0;
        uVar11 = 0;
        do {
          if (uVar10 != 0) {
            puVar20 = storage + (long)iVar16 + 2;
            iVar16 = iVar16 + (uint)uVar2 + (uint)uVar2 * 2;
            uVar21 = 0;
            do {
              uVar5 = -((Get_RGB_Image::byte_array[uVar21 & 7] & pbVar9[iVar15 + uVar21 >> 3]) != 0)
              ;
              puVar20[-2] = uVar5;
              puVar20[-1] = uVar5;
              *puVar20 = uVar5;
              uVar21 = uVar21 + 1;
              puVar20 = puVar20 + 3;
            } while (uVar2 != uVar21);
          }
          uVar11 = uVar11 + 1;
          iVar15 = iVar15 + uVar7;
        } while (uVar11 != uVar3);
      }
    }
    else if (uVar3 != 0) {
      iVar15 = (uVar3 - 1) * (uVar2 + 7 >> 3) * 8;
      iVar16 = 0;
      do {
        if (uVar2 != 0) {
          lVar17 = (long)iVar16;
          lVar19 = 0;
          iVar18 = iVar15;
          do {
            iVar12 = iVar18 + 7;
            if (-1 < iVar18) {
              iVar12 = iVar18;
            }
            uVar5 = -((Get_RGB_Image::byte_array[iVar18 % 8] & pbVar9[iVar12 >> 3]) != 0);
            storage[lVar19 + lVar17] = uVar5;
            storage[lVar19 + lVar17 + 1] = uVar5;
            storage[lVar19 + lVar17 + 2] = uVar5;
            lVar19 = lVar19 + 3;
            iVar18 = iVar18 + 1;
          } while ((uint)uVar2 + (uint)uVar2 * 2 != (int)lVar19);
          iVar16 = iVar16 + (int)lVar19;
        }
        iVar18 = (int)uVar13;
        iVar15 = iVar15 - uVar7;
        uVar13 = (ulong)(iVar18 - 1);
      } while (1 < iVar18);
    }
    return true;
  }
  pAVar4 = pAVar8->color_map;
  if (!top_first) {
    if (uVar13 != 0) {
      pbVar9 = pbVar9 + (uVar13 - 1) * uVar10;
      iVar15 = 0;
      do {
        if (uVar10 != 0) {
          lVar17 = (long)iVar15;
          lVar19 = 0;
          pbVar22 = pbVar9;
          do {
            bVar1 = *pbVar22;
            storage[lVar19 + lVar17] = (uchar)pAVar4[bVar1].red;
            storage[lVar19 + lVar17 + 1] = (uchar)pAVar4[bVar1].green;
            storage[lVar19 + lVar17 + 2] = (uchar)pAVar4[bVar1].blue;
            lVar19 = lVar19 + 3;
            pbVar22 = pbVar22 + 1;
          } while (uVar10 * 3 != lVar19);
          iVar15 = iVar15 + (int)lVar19;
        }
        pbVar9 = pbVar9 + -uVar10;
        bVar6 = 1 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar6);
      return true;
    }
    return true;
  }
  if (uVar13 != 0) {
    uVar14 = 0;
    iVar15 = 0;
    do {
      if (uVar10 != 0) {
        lVar17 = (long)iVar15;
        lVar19 = 0;
        pbVar22 = pbVar9;
        do {
          bVar1 = *pbVar22;
          storage[lVar19 + lVar17] = (uchar)pAVar4[bVar1].red;
          storage[lVar19 + lVar17 + 1] = (uchar)pAVar4[bVar1].green;
          storage[lVar19 + lVar17 + 2] = (uchar)pAVar4[bVar1].blue;
          lVar19 = lVar19 + 3;
          pbVar22 = pbVar22 + 1;
        } while (uVar10 * 3 != lVar19);
        iVar15 = iVar15 + (int)lVar19;
      }
      uVar14 = uVar14 + 1;
      pbVar9 = pbVar9 + uVar10;
    } while (uVar14 != uVar13);
    return true;
  }
  return true;
}

Assistant:

bool
Am_Image_Array_Data::Get_RGB_Image(unsigned char *storage, bool top_first)
{
  if (image_ == nullptr) {
    if (!make_generic_image_from_name())
      return false;
  }

  unsigned char *idata = image_->Get_Data();
  if (idata == nullptr)
    return false;

  unsigned short width, height;
  image_->Get_Size(width, height);

  if (name) {
    // image from file; with colormap
    Am_RGB_Value *ctbl;
    int row, col, index;

    (void)image_->Get_Color_Map(ctbl);
    index = 0;

    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    }
  } else {
    // image from bit data
    // this is how I think X stores bitmaps:
    // - the number of bits in a row is the width of the image is
    //   rounded up to an even multiple of 8
    // - the bits in a byte are stored from right to left !
    int row, col, index;
    static unsigned char byte_array[] = {0x01, 0x02, 0x04, 0x08,
                                         0x10, 0x20, 0x40, 0x80};
    int row_width = (width + 7) / 8 * 8; // round to nearest byte;

    index = 0;
    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    }
  }
  return true;
}